

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lang_model.cpp
# Opt level: O0

double __thiscall NJamSpell::TLangModel::Score(TLangModel *this,TWords *words)

{
  TWordId TVar1;
  TWordId word2;
  pointer this_00;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  ulong local_80;
  size_t i;
  double result;
  TWordId local_5c;
  reference local_58;
  TWord *w;
  const_iterator __end1;
  const_iterator __begin1;
  TWords *__range1;
  TWordIds sentence;
  TWords *words_local;
  TLangModel *this_local;
  
  sentence.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)words;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1);
  this_00 = sentence.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  __end1 = std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::begin
                     ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)
                      sentence.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  w = (TWord *)std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::end
                         ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)this_00);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_NJamSpell::TWord_*,_std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>
                                *)&w);
    if (!bVar2) break;
    local_58 = __gnu_cxx::
               __normal_iterator<const_NJamSpell::TWord_*,_std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>
               ::operator*(&__end1);
    local_5c = GetWordIdNoCreate(this,local_58);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1,&local_5c);
    __gnu_cxx::
    __normal_iterator<const_NJamSpell::TWord_*,_std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>
    ::operator++(&__end1);
  }
  bVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1);
  if (bVar2) {
    this_local = (TLangModel *)std::numeric_limits<double>::min();
  }
  else {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1,&this->UnknownWordId
              );
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1,&this->UnknownWordId
              );
    i = 0;
    local_80 = 0;
    while( true ) {
      sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1);
      if (sVar3 - 2 <= local_80) break;
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1,local_80)
      ;
      dVar5 = GetGram1Prob(this,*pvVar4);
      dVar5 = log(dVar5);
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1,local_80)
      ;
      TVar1 = *pvVar4;
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1,
                          local_80 + 1);
      dVar6 = GetGram2Prob(this,TVar1,*pvVar4);
      dVar6 = log(dVar6);
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1,local_80)
      ;
      TVar1 = *pvVar4;
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1,
                          local_80 + 1);
      word2 = *pvVar4;
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1,
                          local_80 + 2);
      dVar7 = GetGram3Prob(this,TVar1,word2,*pvVar4);
      dVar7 = log(dVar7);
      i = (size_t)(dVar7 + (double)i + dVar5 + dVar6);
      local_80 = local_80 + 1;
    }
    this_local = (TLangModel *)i;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1);
  return (double)this_local;
}

Assistant:

double TLangModel::Score(const TWords& words) const {
    TWordIds sentence;
    for (auto&& w: words) {
        sentence.push_back(GetWordIdNoCreate(w));
    }
    if (sentence.empty()) {
        return std::numeric_limits<double>::min();
    }

    sentence.push_back(UnknownWordId);
    sentence.push_back(UnknownWordId);

    double result = 0;
    for (size_t i = 0; i < sentence.size() - 2; ++i) {
        result += log(GetGram1Prob(sentence[i]));
        result += log(GetGram2Prob(sentence[i], sentence[i + 1]));
        result += log(GetGram3Prob(sentence[i], sentence[i + 1], sentence[i + 2]));
    }
    return result;
}